

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(RowGroup *a,RowGroup *b)

{
  _RowGroup__isset _Var1;
  int16_t iVar2;
  int64_t iVar3;
  
  std::swap<duckdb::vector<duckdb_parquet::ColumnChunk,true>>(&a->columns,&b->columns);
  iVar3 = a->total_byte_size;
  a->total_byte_size = b->total_byte_size;
  b->total_byte_size = iVar3;
  iVar3 = a->num_rows;
  a->num_rows = b->num_rows;
  b->num_rows = iVar3;
  std::swap<duckdb::vector<duckdb_parquet::SortingColumn,true>>
            (&a->sorting_columns,&b->sorting_columns);
  iVar3 = a->file_offset;
  a->file_offset = b->file_offset;
  b->file_offset = iVar3;
  iVar3 = a->total_compressed_size;
  a->total_compressed_size = b->total_compressed_size;
  b->total_compressed_size = iVar3;
  iVar2 = a->ordinal;
  a->ordinal = b->ordinal;
  b->ordinal = iVar2;
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(RowGroup &a, RowGroup &b) {
  using ::std::swap;
  swap(a.columns, b.columns);
  swap(a.total_byte_size, b.total_byte_size);
  swap(a.num_rows, b.num_rows);
  swap(a.sorting_columns, b.sorting_columns);
  swap(a.file_offset, b.file_offset);
  swap(a.total_compressed_size, b.total_compressed_size);
  swap(a.ordinal, b.ordinal);
  swap(a.__isset, b.__isset);
}